

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

char * __thiscall Bstrlib::CBString::gets(CBString *this,char *__s)

{
  bstring x;
  char *pcVar1;
  CBStringException *this_00;
  char in_CL;
  void *in_RDX;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  if (0 < (this->super_tagbstring).mlen) {
    x = bgets((bNgetc)__s,in_RDX,in_CL);
    if (x == (bstring)0x0) {
      (this->super_tagbstring).slen = 0;
      pcVar1 = (char *)0xffffffff;
    }
    else {
      operator=(this,x);
      bdestroy(x);
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Write protection error","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::gets (bNgetc getcPtr, void * parm, char terminator) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bgets (getcPtr, parm, terminator);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}